

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O3

int run_test_uname(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *loop;
  uv_timer_t *handle;
  uv_timer_t *puVar2;
  int64_t eval_b_1;
  int64_t eval_b_2;
  utsname buf;
  uv_utsname_t buffer;
  uv_loop_t *puStack_5b0;
  uv_loop_t *puStack_5a8;
  utsname local_588;
  uv_utsname_t local_400;
  
  iVar1 = uv_os_uname((uv_utsname_t *)0x0);
  local_400.sysname._0_8_ = SEXT48(iVar1);
  local_588.sysname._0_8_ = (uv__queue *)0xffffffffffffffea;
  if (local_400.sysname._0_8_ == -0x16) {
    iVar1 = uv_os_uname(&local_400);
    local_588.sysname._0_8_ = SEXT48(iVar1);
    if ((uv__queue *)local_588.sysname._0_8_ != (uv__queue *)0x0) goto LAB_001dfd30;
    iVar1 = uname(&local_588);
    if (iVar1 == -1) goto LAB_001dfd3d;
    iVar1 = strcmp(local_400.sysname,local_588.sysname);
    if (iVar1 != 0) goto LAB_001dfd4a;
    iVar1 = strcmp(local_400.version,(char *)((long)&local_588 + 0xc3));
    if (iVar1 != 0) goto LAB_001dfd57;
    iVar1 = strcmp(local_400.release,(char *)((long)&local_588 + 0x82));
    if (iVar1 != 0) goto LAB_001dfd64;
    iVar1 = strcmp(local_400.machine,(char *)((long)&local_588 + 0x104));
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_uname_cold_1();
LAB_001dfd30:
    run_test_uname_cold_2();
LAB_001dfd3d:
    run_test_uname_cold_7();
LAB_001dfd4a:
    run_test_uname_cold_3();
LAB_001dfd57:
    run_test_uname_cold_4();
LAB_001dfd64:
    run_test_uname_cold_5();
  }
  run_test_uname_cold_6();
  handle = (uv_timer_t *)&puStack_5b0;
  loop = uv_default_loop();
  iVar1 = uv_timer_init(loop,&timer);
  puStack_5a8 = (uv_loop_t *)(long)iVar1;
  puStack_5b0 = (uv_loop_t *)0x0;
  if (puStack_5a8 == (uv_loop_t *)0x0) {
    iVar1 = uv_timer_start(&timer,timer_cb,1,0);
    puStack_5a8 = (uv_loop_t *)(long)iVar1;
    puStack_5b0 = (uv_loop_t *)0x0;
    if (puStack_5a8 != (uv_loop_t *)0x0) goto LAB_001dfefa;
    puStack_5a8 = (uv_loop_t *)(long)seen_timer_handle;
    puStack_5b0 = (uv_loop_t *)0x0;
    if (puStack_5a8 != (uv_loop_t *)0x0) goto LAB_001dff07;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    puStack_5a8 = (uv_loop_t *)(long)iVar1;
    puStack_5b0 = (uv_loop_t *)0x0;
    if (puStack_5a8 != (uv_loop_t *)0x0) goto LAB_001dff14;
    puStack_5a8 = (uv_loop_t *)0x1;
    puStack_5b0 = (uv_loop_t *)(long)seen_timer_handle;
    if (puStack_5b0 != (uv_loop_t *)0x1) goto LAB_001dff21;
    seen_timer_handle = 0;
    uv_walk(loop,walk_cb,magic_cookie);
    puStack_5a8 = (uv_loop_t *)(long)seen_timer_handle;
    puStack_5b0 = (uv_loop_t *)0x0;
    if (puStack_5a8 == (uv_loop_t *)0x0) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      puStack_5a8 = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(loop);
      puStack_5b0 = (uv_loop_t *)(long)iVar1;
      if (puStack_5a8 == puStack_5b0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001dff3b;
    }
  }
  else {
    run_test_walk_handles_cold_1();
LAB_001dfefa:
    run_test_walk_handles_cold_2();
LAB_001dff07:
    run_test_walk_handles_cold_3();
LAB_001dff14:
    run_test_walk_handles_cold_4();
LAB_001dff21:
    run_test_walk_handles_cold_5();
  }
  run_test_walk_handles_cold_6();
LAB_001dff3b:
  puVar2 = (uv_timer_t *)&puStack_5a8;
  run_test_walk_handles_cold_7();
  if (puVar2 == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close((uv_handle_t *)&timer,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  timer_cb_cold_1();
  if (handle == (uv_timer_t *)magic_cookie) {
    handle = puVar2;
    if (puVar2 == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return extraout_EAX_00;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT_OK(r);

#ifndef _WIN32
  ASSERT_NE(uname(&buf), -1);
  ASSERT_OK(strcmp(buffer.sysname, buf.sysname));
  ASSERT_OK(strcmp(buffer.version, buf.version));

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT_OK(strcmp(buffer.release, temp));
# else
  ASSERT_OK(strcmp(buffer.release, buf.release));
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT_OK(strcmp(buffer.machine, "ppc64"));
# else
  ASSERT_OK(strcmp(buffer.machine, buf.machine));
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}